

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_Utf16HighFollowedByUtf8Char_Test::~JsonString_Utf16HighFollowedByUtf8Char_Test
          (JsonString_Utf16HighFollowedByUtf8Char_Test *this)

{
  JsonString_Utf16HighFollowedByUtf8Char_Test *this_local;
  
  ~JsonString_Utf16HighFollowedByUtf8Char_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Utf16HighFollowedByUtf8Char) {
    // UTF-16 high surrogate followed by non-surrogate UTF-16 hex code point.
    auto p = json::make_parser (proxy_);
    p.input (R"("\uD834!")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::bad_unicode_code_point));
    EXPECT_EQ (p.coordinate (), (json::coord{8U, 1U}));
}